

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<std::complex<float>,_1000>::Expand
          (TPZManVector<std::complex<float>,_1000> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  complex<float> *pcVar3;
  ulong in_RSI;
  long in_RDI;
  int64_t i;
  complex<float> *newstore;
  complex<float> *local_58;
  long local_30;
  
  if ((*(long *)(in_RDI + 0x18) < (long)in_RSI) && (1000 < (long)in_RSI)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RSI;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pcVar3 = (complex<float> *)operator_new__(uVar2);
    if (in_RSI != 0) {
      local_58 = pcVar3;
      do {
        std::complex<float>::complex(local_58,0.0,0.0);
        local_58 = local_58 + 1;
      } while (local_58 != pcVar3 + in_RSI);
    }
    for (local_30 = 0; local_30 < *(long *)(in_RDI + 0x10); local_30 = local_30 + 1) {
      pcVar3[local_30]._M_value = *(_ComplexT *)(*(long *)(in_RDI + 8) + local_30 * 8);
    }
    if ((*(long *)(in_RDI + 8) != in_RDI + 0x20) && (*(void **)(in_RDI + 8) != (void *)0x0)) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(complex<float> **)(in_RDI + 8) = pcVar3;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Expand(const int64_t newsize) {
    // If newsize is negative then return.
    if (newsize <= this->fNAlloc || newsize <= NumExtAlloc) {
        return;
    } else {// the size is larger than the allocated memory
        T* newstore = new T[ newsize ];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc) {
            delete [] this->fStore;
        }

        this->fStore = newstore;
        this->fNAlloc = newsize;
    }
}